

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

KHashMap * KHashMap_Init(KonohaContext *kctx,size_t init)

{
  KHashMap *pKVar1;
  KHashMapEntry *pKVar2;
  KHashMapEntry **ppKVar3;
  ulong in_RSI;
  size_t in_RDI;
  KHashMap *kmap;
  
  pKVar1 = (KHashMap *)(**(code **)(*(long *)(in_RDI + 0x10) + 0x1f8))(in_RDI,0x30,0);
  if (in_RSI < 0x53) {
    in_RSI = 0x53;
  }
  pKVar1->arenasize = in_RSI * 3 >> 2;
  pKVar2 = (KHashMapEntry *)
           (**(code **)(*(long *)(in_RDI + 0x10) + 0x1f0))(in_RDI,pKVar1->arenasize << 5,0);
  pKVar1->arena = pKVar2;
  KHashMap_MakeFreeList(kmap,in_RDI,in_RSI);
  ppKVar3 = (KHashMapEntry **)(**(code **)(*(long *)(in_RDI + 0x10) + 0x1f8))(in_RDI,in_RSI << 3,0);
  pKVar1->hentry = ppKVar3;
  pKVar1->hmax = in_RSI;
  pKVar1->size = 0;
  return pKVar1;
}

Assistant:

KLIBDECL KHashMap *KHashMap_Init(KonohaContext *kctx, size_t init)
{
	KHashMap *kmap = (KHashMap *)KCalloc_UNTRACE(sizeof(KHashMap), 1);
	if(init < HMAP_INIT) init = HMAP_INIT;
	kmap->arenasize = (init * 3) / 4;
	kmap->arena = (KHashMapEntry *)KMalloc_UNTRACE(kmap->arenasize * sizeof(KHashMapEntry));
	KHashMap_MakeFreeList(kmap, 0, kmap->arenasize);
	kmap->hentry = (KHashMapEntry**)KCalloc_UNTRACE(init, sizeof(KHashMapEntry *));
	kmap->hmax = init;
	kmap->size = 0;
	return (KHashMap *)kmap;
}